

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpke_test.cc
# Opt level: O2

void __thiscall
bssl::HPKETest_InvalidRecipientKey_Test::TestBody(HPKETest_InvalidRecipientKey_Test *this)

{
  int iVar1;
  EVP_HPKE_KEM *kem;
  char *in_R9;
  AssertHelper AStack_e8;
  Message local_e0;
  uint8_t private_key [37];
  string local_b0;
  AssertionResult gtest_ar_;
  ScopedEVP_HPKE_KEY key;
  
  private_key[8] = '\0';
  private_key[9] = '\0';
  private_key[10] = '\0';
  private_key[0xb] = '\0';
  private_key[0xc] = '\0';
  private_key[0xd] = '\0';
  private_key[0xe] = '\0';
  private_key[0xf] = '\0';
  private_key[0x10] = '\0';
  private_key[0x11] = '\0';
  private_key[0x12] = '\0';
  private_key[0x13] = '\0';
  private_key[0x14] = '\0';
  private_key[0x15] = '\0';
  private_key[0x16] = '\0';
  private_key[0x17] = '\0';
  private_key[0x18] = '\0';
  private_key[0x19] = '\0';
  private_key[0x1a] = '\0';
  private_key[0x1b] = '\0';
  private_key[0x1c] = '\0';
  private_key[0x1d] = '\0';
  private_key[0x1e] = '\0';
  private_key[0x1f] = '\0';
  private_key[0x20] = '\0';
  private_key[0x21] = '\0';
  private_key[0x22] = '\0';
  private_key[0x23] = '\0';
  private_key[0x24] = '\0';
  private_key[0] = 0xff;
  private_key[1] = '\0';
  private_key[2] = '\0';
  private_key[3] = '\0';
  private_key[4] = '\0';
  private_key[5] = '\0';
  private_key[6] = '\0';
  private_key[7] = '\0';
  EVP_HPKE_KEY_zero(&key.ctx_);
  kem = EVP_hpke_x25519_hkdf_sha256();
  iVar1 = EVP_HPKE_KEY_init(&key.ctx_,kem,private_key,0x25);
  gtest_ar_.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )0x0;
  gtest_ar_.success_ = iVar1 == 0;
  if (!gtest_ar_.success_) {
    testing::Message::Message(&local_e0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_b0,(internal *)&gtest_ar_,
               (AssertionResult *)
               "EVP_HPKE_KEY_init(key.get(), EVP_hpke_x25519_hkdf_sha256(), private_key, sizeof(private_key))"
               ,"true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&AStack_e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/hpke/hpke_test.cc"
               ,0x282,local_b0._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&AStack_e8,&local_e0);
    testing::internal::AssertHelper::~AssertHelper(&AStack_e8);
    std::__cxx11::string::~string((string *)&local_b0);
    if (local_e0.ss_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl !=
        (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )0x0) {
      (**(code **)(*(long *)local_e0.ss_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_.message_);
  internal::
  StackAllocatedMovable<evp_hpke_key_st,_void,_&EVP_HPKE_KEY_zero,_&EVP_HPKE_KEY_cleanup,_&EVP_HPKE_KEY_move>
  ::~StackAllocatedMovable(&key);
  return;
}

Assistant:

TEST(HPKETest, InvalidRecipientKey) {
  const uint8_t private_key[X25519_PUBLIC_VALUE_LEN + 5] = {0xff};
  ScopedEVP_HPKE_KEY key;
  EXPECT_FALSE(EVP_HPKE_KEY_init(key.get(), EVP_hpke_x25519_hkdf_sha256(),
                                 private_key, sizeof(private_key)));
}